

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QRhiDriverInfo *info)

{
  long in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  undefined7 in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffaf;
  QByteArray *in_stack_ffffffffffffffb8;
  Stream *this;
  undefined1 *local_10;
  char *t;
  
  t = *(char **)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,in_RSI);
  QDebug::nospace(in_RSI);
  QDebug::operator<<(in_RSI,t);
  QDebug::operator<<((QDebug *)this,in_stack_ffffffffffffffb8);
  QDebug::operator<<(in_RSI,t);
  QDebug::operator<<((QDebug *)in_RDI,
                     (QTextStreamFunction)
                     CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  QDebug::operator<<((QDebug *)in_RDI,CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8))
  ;
  QDebug::operator<<(in_RSI,t);
  QDebug::operator<<((QDebug *)in_RDI,CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8))
  ;
  QDebug::operator<<(in_RSI,t);
  deviceTypeStr(*(DeviceType *)(in_RDX + 0x28));
  QDebug::operator<<(in_RSI,t);
  QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffffaf);
  QDebug::QDebug((QDebug *)in_RDI,
                 (QDebug *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(char **)(in_FS_OFFSET + 0x28) == t) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QRhiDriverInfo &info)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QRhiDriverInfo(deviceName=" << info.deviceName
                  << " deviceId=0x" << Qt::hex << info.deviceId
                  << " vendorId=0x" << info.vendorId
                  << " deviceType=" << deviceTypeStr(info.deviceType)
                  << ')';
    return dbg;
}